

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O1

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  my_src_ptr src;
  size_t sVar2;
  JOCTET *pJVar3;
  JOCTET *pJVar4;
  
  if (0 < num_bytes) {
    pjVar1 = cinfo->src;
    sVar2 = pjVar1->bytes_in_buffer;
    if ((long)sVar2 < num_bytes) {
      pJVar4 = (JOCTET *)pjVar1[1].bytes_in_buffer;
      do {
        pJVar3 = pJVar4;
        num_bytes = num_bytes - sVar2;
        sVar2 = 0x1000;
        pJVar4 = pJVar3 + 0x1000;
      } while (0x1000 < num_bytes);
      pjVar1[1].bytes_in_buffer = (size_t)pJVar4;
      pjVar1->next_input_byte = pJVar3;
      pjVar1->bytes_in_buffer = 0x1000;
    }
    pjVar1->next_input_byte = pjVar1->next_input_byte + num_bytes;
    pjVar1->bytes_in_buffer = sVar2 - num_bytes;
  }
  return;
}

Assistant:

static void skip_input_data(j_decompress_ptr cinfo, long num_bytes) {
    my_src_ptr src = (my_src_ptr)cinfo->src;
    if (num_bytes > 0) {
      while (num_bytes > (long)src->pub.bytes_in_buffer) {
        num_bytes -= (long)src->pub.bytes_in_buffer;
        fill_input_buffer(cinfo);
      }
      src->pub.next_input_byte += (size_t) num_bytes;
      src->pub.bytes_in_buffer -= (size_t) num_bytes;
    }
  }